

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O2

int xmlDocFormatDump(FILE *f,xmlDocPtr cur,int format)

{
  int iVar1;
  xmlOutputBufferPtr buf;
  
  if (cur != (xmlDocPtr)0x0) {
    buf = xmlOutputBufferCreateFile(f,(xmlCharEncodingHandlerPtr)0x0);
    if (buf != (xmlOutputBufferPtr)0x0) {
      xmlDocDumpInternal(buf,cur,(char *)0x0,format);
      iVar1 = xmlOutputBufferClose(buf);
      return iVar1;
    }
  }
  return -1;
}

Assistant:

int
xmlDocFormatDump(FILE *f, xmlDocPtr cur, int format) {
    xmlOutputBufferPtr buf;

    if (cur == NULL) {
	return(-1);
    }

    buf = xmlOutputBufferCreateFile(f, NULL);
    if (buf == NULL) return(-1);

    xmlDocDumpInternal(buf, cur, NULL, format);

    return(xmlOutputBufferClose(buf));
}